

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

float ImGui::RoundScalarWithFormatT<float,float>(char *format,ImGuiDataType data_type,float v)

{
  char cVar1;
  char *in_RAX;
  char cVar2;
  int iVar3;
  long lVar4;
  char *__nptr;
  char *pcVar5;
  double dVar6;
  char v_str [64];
  char local_58 [72];
  
  do {
    cVar1 = *format;
    if (cVar1 == '\0') {
      iVar3 = 3;
      pcVar5 = in_RAX;
    }
    else if ((cVar1 != '%') || (iVar3 = 1, pcVar5 = format, format[1] == '%')) {
      format = format + (ulong)(cVar1 == '%') + 1;
      iVar3 = 0;
      pcVar5 = in_RAX;
    }
    in_RAX = pcVar5;
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    format = pcVar5;
  }
  if ((*format == '%') && (format[1] != '%')) {
    ImFormatString(local_58,0x40,format,(double)v);
    pcVar5 = local_58;
    do {
      __nptr = pcVar5;
      cVar1 = *__nptr;
      pcVar5 = __nptr + 1;
    } while (cVar1 == ' ');
    if ((data_type & 0xfffffffeU) == 8) {
      dVar6 = atof(__nptr);
      v = (float)dVar6;
    }
    else {
      lVar4 = (ulong)(__nptr[cVar1 == '-'] == '+') + (ulong)(cVar1 == '-');
      cVar2 = __nptr[lVar4];
      v = 0.0;
      if ((byte)(cVar2 - 0x30U) < 10) {
        pcVar5 = __nptr + 1 + lVar4;
        do {
          v = v * 10.0 + (float)(byte)(cVar2 - 0x30);
          cVar2 = *pcVar5;
          pcVar5 = pcVar5 + 1;
        } while ((byte)(cVar2 - 0x30U) < 10);
      }
      if (cVar1 == '-') {
        v = -v;
      }
    }
  }
  return v;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}